

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

optional<std::pair<CNetMessage,_bool>_> * __thiscall
CNode::PollMessage(optional<std::pair<CNetMessage,_bool>_> *__return_storage_ptr__,CNode *this)

{
  _List_node_base *p_Var1;
  _Alloc_hider _Var2;
  list<CNetMessage,_std::allocator<CNetMessage>_> *plVar3;
  size_t *psVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  ulong uVar10;
  _List_node_base *p_Var11;
  _Alloc_hider _Var12;
  long in_FS_OFFSET;
  list<CNetMessage,_std::allocator<CNetMessage>_> msgs;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock102;
  _List_base<CNetMessage,_std::allocator<CNetMessage>_> local_b0;
  unique_lock<std::mutex> uStack_98;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_88;
  _List_node_base *local_70;
  _List_node_base *local_68;
  _List_node_base *p_Stack_60;
  _List_node_base *local_58;
  undefined8 local_50;
  _List_node_base local_48;
  undefined1 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_98._M_device = &(this->m_msg_process_queue_mutex).super_mutex;
  uStack_98._M_owns = false;
  std::unique_lock<std::mutex>::lock(&uStack_98);
  plVar3 = &this->m_msg_process_queue;
  p_Var11 = (_List_node_base *)
            (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var11 == (_List_node_base *)plVar3) {
    (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
    _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_engaged = false;
  }
  else {
    local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
    local_b0._M_impl._M_node._M_size = 0;
    local_b0._M_impl._M_node.super__List_node_base._M_prev =
         local_b0._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var11->_M_next !=
        (_List_node_base *)local_b0._M_impl._M_node.super__List_node_base._M_next &&
        local_b0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)p_Var11) {
      std::__detail::_List_node_base::_M_transfer((_List_node_base *)&local_b0,p_Var11);
      local_b0._M_impl._M_node._M_size = local_b0._M_impl._M_node._M_size + 1;
      psVar4 = &(this->m_msg_process_queue).
                super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node._M_size;
      *psVar4 = *psVar4 - 1;
      p_Var11 = (_List_node_base *)
                (this->m_msg_process_queue).
                super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
                super__List_node_base._M_next;
    }
    uVar10 = this->m_msg_process_queue_size -
             (ulong)*(uint *)((long)&((_List_node_base *)
                                     (local_b0._M_impl._M_node.super__List_node_base._M_next + 3))->
                                     _M_prev + 4);
    this->m_msg_process_queue_size = uVar10;
    LOCK();
    (this->fPauseRecv)._M_base._M_i = this->m_recv_flood_size < uVar10;
    UNLOCK();
    p_Var8 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 1))->
             _M_next;
    p_Var9 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 1))->
             _M_prev;
    p_Var5 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 2))->
             _M_next;
    ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 1))->_M_next =
         (_List_node_base *)0x0;
    ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 1))->_M_prev =
         (_List_node_base *)0x0;
    ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 2))->_M_next =
         (_List_node_base *)0x0;
    p_Var6 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 2))->
             _M_prev;
    local_70 = p_Var6;
    local_68 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 3))->
               _M_next;
    p_Stack_60 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 3))->
                 _M_prev;
    local_58 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 4))->
               _M_next;
    p_Var1 = (_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 5);
    if (local_58 == p_Var1) {
      local_48._M_next = p_Var1->_M_next;
      local_48._M_prev =
           ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 5))->
           _M_prev;
      _Var12._M_p = (pointer)&local_48;
    }
    else {
      local_48._M_next = p_Var1->_M_next;
      _Var12._M_p = (pointer)local_58;
    }
    p_Var7 = ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 4))->
             _M_prev;
    ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 4))->_M_next =
         p_Var1;
    ((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 4))->_M_prev =
         (_List_node_base *)0x0;
    *(undefined1 *)
     &((_List_node_base *)(local_b0._M_impl._M_node.super__List_node_base._M_next + 5))->_M_next = 0
    ;
    *(_List_node_base **)
     &(__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
      _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.m_recv =
         p_Var8;
    *(_List_node_base **)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>)._M_payload.
             super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
             super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
             m_recv + 8) = p_Var9;
    *(_List_node_base **)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>)._M_payload.
             super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
             super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
             m_recv + 0x10) = p_Var5;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(_List_node_base **)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>)._M_payload.
             super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
             super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
             m_recv + 0x18) = p_Var6;
    (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
    _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.m_time.__r
         = (rep)local_68;
    *(_List_node_base **)
     &(__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
      _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
      m_message_size = p_Stack_60;
    _Var2._M_p = (pointer)((long)&(__return_storage_ptr__->
                                  super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
                                  _M_payload.
                                  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>
                                  .super__Optional_payload_base<std::pair<CNetMessage,_bool>_>.
                                  _M_payload._M_value.first.m_type + 0x10);
    (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
    _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.m_type.
    _M_dataplus._M_p = _Var2._M_p;
    if ((_List_node_base *)_Var12._M_p == &local_48) {
      *(_List_node_base **)_Var2._M_p = local_48._M_next;
      *(_List_node_base **)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>)._M_payload.
               super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
               super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first
               .m_type + 0x18) = local_48._M_prev;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
      _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.m_type.
      _M_dataplus._M_p = _Var12._M_p;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)&(__return_storage_ptr__->
                  super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>)._M_payload.
                  super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
                  super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.
                  first.m_type + 0x10))->_M_allocated_capacity = (size_type)local_48._M_next;
    }
    *(_List_node_base **)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>)._M_payload.
             super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
             super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.first.
             m_type + 8) = p_Var7;
    local_50 = 0;
    local_48._M_next = (_List_node_base *)((ulong)local_48._M_next & 0xffffffffffffff00);
    (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
    _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_payload._M_value.second =
         p_Var11 != (_List_node_base *)plVar3;
    (__return_storage_ptr__->super__Optional_base<std::pair<CNetMessage,_bool>,_false,_false>).
    _M_payload.super__Optional_payload<std::pair<CNetMessage,_bool>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<CNetMessage,_bool>_>._M_engaged = true;
    local_58 = &local_48;
    local_38 = p_Var11 != (_List_node_base *)plVar3;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_88);
    std::__cxx11::_List_base<CNetMessage,_std::allocator<CNetMessage>_>::_M_clear(&local_b0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<CNetMessage, bool>> CNode::PollMessage()
{
    LOCK(m_msg_process_queue_mutex);
    if (m_msg_process_queue.empty()) return std::nullopt;

    std::list<CNetMessage> msgs;
    // Just take one message
    msgs.splice(msgs.begin(), m_msg_process_queue, m_msg_process_queue.begin());
    m_msg_process_queue_size -= msgs.front().m_raw_message_size;
    fPauseRecv = m_msg_process_queue_size > m_recv_flood_size;

    return std::make_pair(std::move(msgs.front()), !m_msg_process_queue.empty());
}